

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

ErrorCode re2::RegexpErrorToRE2(RegexpStatusCode code)

{
  ErrorCode local_c;
  RegexpStatusCode code_local;
  
  switch(code) {
  case kRegexpSuccess:
    local_c = NoError;
    break;
  case kRegexpInternalError:
    local_c = ErrorInternal;
    break;
  case kRegexpBadEscape:
    local_c = ErrorBadEscape;
    break;
  case kRegexpBadCharClass:
    local_c = ErrorBadCharClass;
    break;
  case kRegexpBadCharRange:
    local_c = ErrorBadCharRange;
    break;
  case kRegexpMissingBracket:
    local_c = ErrorMissingBracket;
    break;
  case kRegexpMissingParen:
    local_c = ErrorMissingParen;
    break;
  case kRegexpTrailingBackslash:
    local_c = ErrorTrailingBackslash;
    break;
  case kRegexpRepeatArgument:
    local_c = ErrorRepeatArgument;
    break;
  case kRegexpRepeatSize:
    local_c = ErrorRepeatSize;
    break;
  case kRegexpRepeatOp:
    local_c = ErrorRepeatOp;
    break;
  case kRegexpBadPerlOp:
    local_c = ErrorBadPerlOp;
    break;
  case kRegexpBadUTF8:
    local_c = ErrorBadUTF8;
    break;
  case kRegexpBadNamedCapture:
    local_c = ErrorBadNamedCapture;
    break;
  default:
    local_c = ErrorInternal;
  }
  return local_c;
}

Assistant:

static RE2::ErrorCode RegexpErrorToRE2(re2::RegexpStatusCode code) {
  switch (code) {
    case re2::kRegexpSuccess:
      return RE2::NoError;
    case re2::kRegexpInternalError:
      return RE2::ErrorInternal;
    case re2::kRegexpBadEscape:
      return RE2::ErrorBadEscape;
    case re2::kRegexpBadCharClass:
      return RE2::ErrorBadCharClass;
    case re2::kRegexpBadCharRange:
      return RE2::ErrorBadCharRange;
    case re2::kRegexpMissingBracket:
      return RE2::ErrorMissingBracket;
    case re2::kRegexpMissingParen:
      return RE2::ErrorMissingParen;
    case re2::kRegexpTrailingBackslash:
      return RE2::ErrorTrailingBackslash;
    case re2::kRegexpRepeatArgument:
      return RE2::ErrorRepeatArgument;
    case re2::kRegexpRepeatSize:
      return RE2::ErrorRepeatSize;
    case re2::kRegexpRepeatOp:
      return RE2::ErrorRepeatOp;
    case re2::kRegexpBadPerlOp:
      return RE2::ErrorBadPerlOp;
    case re2::kRegexpBadUTF8:
      return RE2::ErrorBadUTF8;
    case re2::kRegexpBadNamedCapture:
      return RE2::ErrorBadNamedCapture;
  }
  return RE2::ErrorInternal;
}